

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void xmlListClear(xmlListPtr l)

{
  xmlLinkPtr pxVar1;
  _xmlLink *p_Var2;
  _func_void_xmlLinkPtr *p_Var3;
  xmlLinkPtr pxVar4;
  
  if ((l != (xmlListPtr)0x0) && (pxVar4 = l->sentinel->next, pxVar4 != l->sentinel)) {
    do {
      pxVar1 = pxVar4->next;
      p_Var2 = pxVar4->prev;
      p_Var3 = l->linkDeallocator;
      p_Var2->next = pxVar1;
      pxVar1->prev = p_Var2;
      if (p_Var3 != (_func_void_xmlLinkPtr *)0x0) {
        (*p_Var3)(pxVar4);
      }
      (*xmlFree)(pxVar4);
      pxVar4 = pxVar1;
    } while (pxVar1 != l->sentinel);
  }
  return;
}

Assistant:

void
xmlListClear(xmlListPtr l)
{
    xmlLinkPtr  lk;

    if (l == NULL)
        return;
    lk = l->sentinel->next;
    while(lk != l->sentinel) {
        xmlLinkPtr next = lk->next;

        xmlLinkDeallocator(l, lk);
        lk = next;
    }
}